

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paraglob_serializer.cpp
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
paraglob::ParaglobSerializer::unserialize_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,ParaglobSerializer *this,
          unique_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          *vsp)

{
  byte bVar1;
  ulong uVar2;
  underflow_error *this_00;
  byte *pbVar3;
  code *pcVar4;
  pointer_____offset_0x10___ *ppuVar5;
  ulong __n;
  iterator vsp_it;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_40;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pbVar3 = (byte *)**(undefined8 **)this;
  __n = (ulong)*pbVar3;
  local_40._M_current = pbVar3 + 8;
  if ((byte *)(*(undefined8 **)this)[1] < local_40._M_current) {
    this_00 = (underflow_error *)__cxa_allocate_exception(0x10);
    std::underflow_error::underflow_error(this_00,"Serialization data ended unexpectedly.");
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(__return_storage_ptr__,__n);
    pbVar3 = *(byte **)(*(long *)this + 8);
    if (local_40._M_current < pbVar3) {
      do {
        bVar1 = *local_40._M_current;
        local_38._M_current = local_40._M_current + (ulong)bVar1 + 8;
        local_40._M_current = local_40._M_current + 8;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>&,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,&local_40,&local_38);
        local_40._M_current = local_40._M_current + bVar1;
        pbVar3 = *(byte **)(*(long *)this + 8);
      } while (local_40._M_current < pbVar3);
    }
    if (pbVar3 < local_40._M_current) {
      this_00 = (underflow_error *)__cxa_allocate_exception(0x10);
      std::underflow_error::underflow_error(this_00,"Serialization data ended unexpectedly.");
    }
    else {
      uVar2 = (long)(__return_storage_ptr__->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(__return_storage_ptr__->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5;
      if (__n < uVar2) {
        this_00 = (underflow_error *)__cxa_allocate_exception(0x10);
        std::overflow_error::overflow_error
                  ((overflow_error *)this_00,"Read more patterns than expected.");
        *(undefined ***)this_00 = &PTR__overflow_error_0010ed78;
        pcVar4 = std::overflow_error::~overflow_error;
        ppuVar5 = &overflow_error::typeinfo;
        goto LAB_00107feb;
      }
      if (__n <= uVar2) {
        return __return_storage_ptr__;
      }
      this_00 = (underflow_error *)__cxa_allocate_exception(0x10);
      std::underflow_error::underflow_error(this_00,"Read fewer patterns than expected.");
    }
  }
  *(undefined ***)this_00 = &PTR__underflow_error_0010ed50;
  pcVar4 = std::underflow_error::~underflow_error;
  ppuVar5 = &underflow_error::typeinfo;
LAB_00107feb:
  __cxa_throw(this_00,ppuVar5,pcVar4);
}

Assistant:

std::vector<std::string> paraglob::ParaglobSerializer::unserialize
  (const std::unique_ptr<std::vector<uint8_t>>& vsp) {
    std::vector<std::string> ret;

    std::vector<uint8_t>::iterator vsp_it = vsp->begin();
    uint64_t n_strings = get_int_and_move(vsp_it);

    // If n_strings is zero vsp_it will equal vsp->end
    if (vsp_it > vsp->end()){
      throw paraglob::underflow_error("Serialization data ended unexpectedly.");
    }
    // Reserve space ahead of time rather than resizing in loop.
    ret.reserve(n_strings);

    while (vsp_it < vsp->end()) {
      uint64_t l = get_int_and_move(vsp_it);
      ret.emplace_back(vsp_it, vsp_it + l);
      std::advance(vsp_it, l);
    }

    // If the read was successful, we have advanced our iterator exactly to the
    // end, and we have read exactly n_strings.
    if (vsp_it > vsp->end()) {
      throw paraglob::underflow_error("Serialization data ended unexpectedly.");
    } else if (ret.size() > n_strings) {
      throw paraglob::overflow_error("Read more patterns than expected.");
    } else if (ret.size() < n_strings) {
      throw paraglob::underflow_error("Read fewer patterns than expected.");
    }

    return ret;
  }